

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O0

void av1_update_noise_estimate(AV1_COMP *cpi)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  NOISE_LEVEL NVar4;
  long *in_RDI;
  uint hist_index;
  uint variance;
  uint sse;
  int consec_zeromv;
  int bl_index3;
  int bl_index2;
  int bl_index1;
  int bl_index_1;
  int bl_index;
  int frame_low_motion;
  int num_low_motion;
  int mi_col;
  int mi_row;
  int last_src_ystride;
  uint8_t *last_src_y;
  int src_ystride;
  uint8_t *src_y;
  BLOCK_SIZE bsize;
  uint bin_cnt;
  uint max_bin_count;
  uint max_bin;
  uint hist_avg [20];
  uint hist [20];
  uint bin_size;
  YV12_BUFFER_CONFIG *last_source;
  int frame_counter;
  int thresh_consec_zeromv;
  int frame_period;
  int low_res;
  NOISE_ESTIMATE *ne;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  uint local_170;
  uint local_164;
  bool local_149;
  undefined1 local_140 [4];
  uint local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  uint local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  long local_110;
  int local_104;
  long local_100;
  byte local_f5;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint auStack_e8 [20];
  uint local_98 [23];
  uint local_3c;
  long local_38;
  int local_30;
  int local_2c;
  int local_28;
  uint local_24;
  NOISE_ESTIMATE *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_10 = in_RDI + 0x77f0;
  local_18 = in_RDI + 0x7831;
  local_20 = (NOISE_ESTIMATE *)(in_RDI + 0x13a9c);
  local_149 = false;
  if ((int)in_RDI[0x77f7] < 0x161) {
    local_149 = *(int *)((long)in_RDI + 0x3bfbc) < 0x121;
  }
  local_24 = (uint)local_149;
  local_28 = 8;
  local_2c = 2;
  local_30 = (int)in_RDI[0x77f2];
  local_38 = in_RDI[0x84f6];
  local_8 = in_RDI;
  iVar2 = enable_noise_estimation
                    ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_20->enabled = iVar2;
  if (1 < (int)local_8[0x13a67]) {
    local_30 = (int)local_8[0x13a6b];
  }
  if ((((local_20->enabled == 0) || (local_30 % local_28 != 0)) || (local_38 == 0)) ||
     (((int)local_8[0x13a67] == 1 &&
      ((local_20->last_w != (int)local_10[7] ||
       (local_20->last_h != *(int *)((long)local_10 + 0x3c))))))) {
    if (local_38 != 0) {
      local_20->last_w = (int)local_10[7];
      local_20->last_h = *(int *)((long)local_10 + 0x3c);
    }
  }
  else {
    if (((0x3c < local_30) && (1 < (int)local_8[0x13a75])) &&
       (((int)local_8[0x13a67] < (int)local_8[0xc0f4] &&
        ((int)local_8[0x13a66] == (int)local_8[0x13a67] + -1)))) {
      iVar2 = 0x28;
      if (local_24 != 0) {
        iVar2 = 0x3c;
      }
      if ((int)local_8[0xc109] < iVar2) {
        local_20->level = kLowLow;
        local_20->count = 0;
        local_20->num_frames_estimate = 10;
        return;
      }
    }
    local_3c = 100;
    memset(local_98,0,0x50);
    local_ec = 0;
    local_f0 = 0;
    local_f5 = 6;
    local_100 = *(long *)(local_8[0x84f5] + 0x28);
    local_104 = *(int *)(local_8[0x84f5] + 0x20);
    local_110 = *(long *)(local_38 + 0x28);
    local_114 = *(int *)(local_38 + 0x20);
    local_120 = 0;
    for (local_118 = 0; local_118 < *(int *)((long)local_18 + 0xc); local_118 = local_118 + 2) {
      for (local_11c = 0; local_11c < (int)local_18[2]; local_11c = local_11c + 2) {
        local_128 = (local_118 >> 1) * ((int)local_18[2] >> 1) + (local_11c >> 1);
        if (local_2c < (int)(uint)*(byte *)(local_8[0x13aa1] + (long)local_128)) {
          local_120 = local_120 + 1;
        }
      }
    }
    local_124 = (uint)(*(int *)((long)local_18 + 0xc) * (int)local_18[2] * 3 >> 5 <= local_120);
    for (local_118 = 0; local_118 < *(int *)((long)local_18 + 0xc); local_118 = local_118 + 1) {
      for (local_11c = 0; local_11c < (int)local_18[2]; local_11c = local_11c + 1) {
        if ((((local_118 % 8 == 0) && (local_11c % 8 == 0)) &&
            (local_118 < *(int *)((long)local_18 + 0xc) + -3)) &&
           (local_11c < (int)local_18[2] + -3)) {
          local_12c = (local_118 >> 1) * ((int)local_18[2] >> 1) + (local_11c >> 1);
          local_130 = local_12c + 1;
          local_134 = local_12c + ((int)local_18[2] >> 1);
          local_138 = local_134 + 1;
          if (*(byte *)(local_8[0x13aa1] + (long)local_134) <
              *(byte *)(local_8[0x13aa1] + (long)local_138)) {
            bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_134);
          }
          else {
            bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_138);
          }
          if (*(byte *)(local_8[0x13aa1] + (long)local_130) < bVar1) {
            bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_130);
          }
          else if (*(byte *)(local_8[0x13aa1] + (long)local_134) <
                   *(byte *)(local_8[0x13aa1] + (long)local_138)) {
            bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_134);
          }
          else {
            bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_138);
          }
          if (*(byte *)(local_8[0x13aa1] + (long)local_12c) < bVar1) {
            local_164 = (uint)*(byte *)(local_8[0x13aa1] + (long)local_12c);
          }
          else {
            if (*(byte *)(local_8[0x13aa1] + (long)local_134) <
                *(byte *)(local_8[0x13aa1] + (long)local_138)) {
              bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_134);
            }
            else {
              bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_138);
            }
            if (*(byte *)(local_8[0x13aa1] + (long)local_130) < bVar1) {
              bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_130);
            }
            else if (*(byte *)(local_8[0x13aa1] + (long)local_134) <
                     *(byte *)(local_8[0x13aa1] + (long)local_138)) {
              bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_134);
            }
            else {
              bVar1 = *(byte *)(local_8[0x13aa1] + (long)local_138);
            }
            local_170 = (uint)bVar1;
            local_164 = local_170;
          }
          local_13c = local_164;
          if (((local_124 != 0) && (local_2c < (int)local_164)) && ((int)local_8[0xc0f6] == 0)) {
            uVar3 = (**(code **)(*local_8 + (ulong)local_f5 * 0x70 + 0xc918))
                              (local_100,local_104,local_110,local_114,local_140);
            uVar3 = uVar3 / local_3c;
            if (uVar3 < 0x14) {
              local_98[uVar3] = local_98[uVar3] + 1;
            }
            else if (uVar3 < 0x1e) {
              local_98[0x13] = local_98[0x13] + 1;
            }
          }
        }
        local_100 = local_100 + 4;
        local_110 = local_110 + 4;
      }
      local_100 = local_100 + (local_104 * 4 + (int)local_18[2] * -4);
      local_110 = local_110 + (local_114 * 4 + (int)local_18[2] * -4);
    }
    local_20->last_w = (int)local_10[7];
    local_20->last_h = *(int *)((long)local_10 + 0x3c);
    if ((10 < local_98[0]) && (local_98[0] >> 2 < local_98[0x13])) {
      local_98[0] = 0;
      local_98[1] = local_98[1] >> 2;
      local_98[2] = local_98[2] >> 2;
      local_98[3] = local_98[3] >> 2;
      local_98[4] = local_98[4] >> 1;
      local_98[5] = local_98[5] >> 1;
      local_98[6] = local_98[6] * 3 >> 1;
      local_98[0x13] = local_98[0x13] >> 1;
    }
    for (local_f4 = 0; local_f4 < 0x14; local_f4 = local_f4 + 1) {
      if (local_f4 == 0) {
        auStack_e8[0] = (local_98[0] + local_98[1] + local_98[2]) / 3;
      }
      else if (local_f4 == 0x13) {
        auStack_e8[0x13] = local_98[0x13] >> 2;
      }
      else if (local_f4 == 0x12) {
        auStack_e8[0x12] = local_98[0x11] + local_98[0x12] * 2 + (local_98[0x13] >> 1) + 2 >> 2;
      }
      else {
        auStack_e8[local_f4] =
             local_98[local_f4 - 1] + local_98[local_f4] * 2 + local_98[local_f4 + 1] + 2 >> 2;
      }
      if (local_f0 < auStack_e8[local_f4]) {
        local_f0 = auStack_e8[local_f4];
        local_ec = local_f4;
      }
    }
    local_20->value = local_20->value * 3 + local_ec * 0x28 >> 2;
    if ((local_20->level < kMedium) && (local_20->adapt_thresh < local_20->value)) {
      local_20->count = local_20->num_frames_estimate;
    }
    else {
      local_20->count = local_20->count + 1;
    }
    if (local_20->count == local_20->num_frames_estimate) {
      local_20->num_frames_estimate = 0x1e;
      local_20->count = 0;
      NVar4 = av1_noise_estimate_extract_level(local_20);
      local_20->level = NVar4;
    }
  }
  return;
}

Assistant:

void av1_update_noise_estimate(AV1_COMP *const cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  NOISE_ESTIMATE *const ne = &cpi->noise_estimate;
  const int low_res = (cm->width <= 352 && cm->height <= 288);
  // Estimate of noise level every frame_period frames.
  int frame_period = 8;
  int thresh_consec_zeromv = 2;
  int frame_counter = cm->current_frame.frame_number;
  // Estimate is between current source and last source.
  YV12_BUFFER_CONFIG *last_source = cpi->last_source;
#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi)) {
    last_source = &cpi->denoiser.last_source;
    // Tune these thresholds for different resolutions when denoising is
    // enabled.
    if (cm->width > 640 && cm->width <= 1920) {
      thresh_consec_zeromv = 2;
    }
  }
#endif
  ne->enabled = enable_noise_estimation(cpi);
  if (cpi->svc.number_spatial_layers > 1)
    frame_counter = cpi->svc.current_superframe;
  if (!ne->enabled || frame_counter % frame_period != 0 ||
      last_source == NULL ||
      (cpi->svc.number_spatial_layers == 1 &&
       (ne->last_w != cm->width || ne->last_h != cm->height))) {
#if CONFIG_AV1_TEMPORAL_DENOISING
    if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi))
      copy_frame(&cpi->denoiser.last_source, cpi->source);
#endif
    if (last_source != NULL) {
      ne->last_w = cm->width;
      ne->last_h = cm->height;
    }
    return;
  } else if (frame_counter > 60 && cpi->svc.num_encoded_top_layer > 1 &&
             cpi->rc.frames_since_key > cpi->svc.number_spatial_layers &&
             cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1 &&
             cpi->rc.avg_frame_low_motion < (low_res ? 60 : 40)) {
    // Force noise estimation to 0 and denoiser off if content has high motion.
    ne->level = kLowLow;
    ne->count = 0;
    ne->num_frames_estimate = 10;
#if CONFIG_AV1_TEMPORAL_DENOISING
    if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi) &&
        cpi->svc.current_superframe > 1) {
      av1_denoiser_set_noise_level(cpi, ne->level);
      copy_frame(&cpi->denoiser.last_source, cpi->source);
    }
#endif
    return;
  } else {
    unsigned int bin_size = 100;
    unsigned int hist[MAX_VAR_HIST_BINS] = { 0 };
    unsigned int hist_avg[MAX_VAR_HIST_BINS];
    unsigned int max_bin = 0;
    unsigned int max_bin_count = 0;
    unsigned int bin_cnt;
    BLOCK_SIZE bsize = BLOCK_16X16;
    // Loop over sub-sample of 16x16 blocks of frame, and for blocks that have
    // been encoded as zero/small mv at least x consecutive frames, compute
    // the variance to update estimate of noise in the source.
    const uint8_t *src_y = cpi->source->y_buffer;
    const int src_ystride = cpi->source->y_stride;
    const uint8_t *last_src_y = last_source->y_buffer;
    const int last_src_ystride = last_source->y_stride;
    int mi_row, mi_col;
    int num_low_motion = 0;
    int frame_low_motion = 1;
    for (mi_row = 0; mi_row < mi_params->mi_rows; mi_row += 2) {
      for (mi_col = 0; mi_col < mi_params->mi_cols; mi_col += 2) {
        int bl_index =
            (mi_row >> 1) * (mi_params->mi_cols >> 1) + (mi_col >> 1);
        if (cpi->consec_zero_mv[bl_index] > thresh_consec_zeromv)
          num_low_motion++;
      }
    }
    if (num_low_motion <
        (((3 * (mi_params->mi_rows * mi_params->mi_cols) >> 2)) >> 3))
      frame_low_motion = 0;
    for (mi_row = 0; mi_row < mi_params->mi_rows; mi_row++) {
      for (mi_col = 0; mi_col < mi_params->mi_cols; mi_col++) {
        // 16x16 blocks, 1/4 sample of frame.
        if (mi_row % 8 == 0 && mi_col % 8 == 0 &&
            mi_row < mi_params->mi_rows - 3 &&
            mi_col < mi_params->mi_cols - 3) {
          int bl_index =
              (mi_row >> 1) * (mi_params->mi_cols >> 1) + (mi_col >> 1);
          int bl_index1 = bl_index + 1;
          int bl_index2 = bl_index + (mi_params->mi_cols >> 1);
          int bl_index3 = bl_index2 + 1;
          int consec_zeromv =
              AOMMIN(cpi->consec_zero_mv[bl_index],
                     AOMMIN(cpi->consec_zero_mv[bl_index1],
                            AOMMIN(cpi->consec_zero_mv[bl_index2],
                                   cpi->consec_zero_mv[bl_index3])));
          // Only consider blocks that are likely steady background. i.e, have
          // been encoded as zero/low motion x (= thresh_consec_zeromv) frames
          // in a row. consec_zero_mv[] defined for 8x8 blocks, so consider all
          // 4 sub-blocks for 16x16 block. And exclude this frame if
          // high_source_sad is true (i.e., scene/content change).
          if (frame_low_motion && consec_zeromv > thresh_consec_zeromv &&
              !cpi->rc.high_source_sad) {
            unsigned int sse;
            // Compute variance between co-located blocks from current and
            // last input frames.
            unsigned int variance = cpi->ppi->fn_ptr[bsize].vf(
                src_y, src_ystride, last_src_y, last_src_ystride, &sse);
            unsigned int hist_index = variance / bin_size;
            if (hist_index < MAX_VAR_HIST_BINS)
              hist[hist_index]++;
            else if (hist_index < 3 * (MAX_VAR_HIST_BINS >> 1))
              hist[MAX_VAR_HIST_BINS - 1]++;  // Account for the tail
          }
        }
        src_y += 4;
        last_src_y += 4;
      }
      src_y += (src_ystride << 2) - (mi_params->mi_cols << 2);
      last_src_y += (last_src_ystride << 2) - (mi_params->mi_cols << 2);
    }
    ne->last_w = cm->width;
    ne->last_h = cm->height;
    // Adjust histogram to account for effect that histogram flattens
    // and shifts to zero as scene darkens.
    if (hist[0] > 10 && (hist[MAX_VAR_HIST_BINS - 1] > hist[0] >> 2)) {
      hist[0] = 0;
      hist[1] >>= 2;
      hist[2] >>= 2;
      hist[3] >>= 2;
      hist[4] >>= 1;
      hist[5] >>= 1;
      hist[6] = 3 * hist[6] >> 1;
      hist[MAX_VAR_HIST_BINS - 1] >>= 1;
    }

    // Average hist[] and find largest bin
    for (bin_cnt = 0; bin_cnt < MAX_VAR_HIST_BINS; bin_cnt++) {
      if (bin_cnt == 0)
        hist_avg[bin_cnt] = (hist[0] + hist[1] + hist[2]) / 3;
      else if (bin_cnt == MAX_VAR_HIST_BINS - 1)
        hist_avg[bin_cnt] = hist[MAX_VAR_HIST_BINS - 1] >> 2;
      else if (bin_cnt == MAX_VAR_HIST_BINS - 2)
        hist_avg[bin_cnt] = (hist[bin_cnt - 1] + 2 * hist[bin_cnt] +
                             (hist[bin_cnt + 1] >> 1) + 2) >>
                            2;
      else
        hist_avg[bin_cnt] =
            (hist[bin_cnt - 1] + 2 * hist[bin_cnt] + hist[bin_cnt + 1] + 2) >>
            2;

      if (hist_avg[bin_cnt] > max_bin_count) {
        max_bin_count = hist_avg[bin_cnt];
        max_bin = bin_cnt;
      }
    }
    // Scale by 40 to work with existing thresholds
    ne->value = (int)((3 * ne->value + max_bin * 40) >> 2);
    // Quickly increase VNR strength when the noise level increases suddenly.
    if (ne->level < kMedium && ne->value > ne->adapt_thresh) {
      ne->count = ne->num_frames_estimate;
    } else {
      ne->count++;
    }
    if (ne->count == ne->num_frames_estimate) {
      // Reset counter and check noise level condition.
      ne->num_frames_estimate = 30;
      ne->count = 0;
      ne->level = av1_noise_estimate_extract_level(ne);
#if CONFIG_AV1_TEMPORAL_DENOISING
      if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi))
        av1_denoiser_set_noise_level(cpi, ne->level);
#endif
    }
  }
#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi))
    copy_frame(&cpi->denoiser.last_source, cpi->source);
#endif
}